

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::CCOutputs::Add
          (CCOutputs *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer pcVar1;
  cmGlobalNinjaGenerator *this_00;
  bool bVar2;
  string *psVar3;
  pointer pbVar4;
  pointer path;
  string out;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  string local_68;
  pointer local_48;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  path = (paths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (path != pbVar4) {
    local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->WorkDirOuts;
    local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->ExplicitOuts;
    local_48 = pbVar4;
    do {
      psVar3 = ConvertToNinjaPath(this->GG,path);
      pcVar1 = (psVar3->_M_dataplus)._M_p;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + psVar3->_M_string_length);
      bVar2 = cmsys::SystemTools::FileIsFullPath(&local_68);
      if (!bVar2) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>(local_40,&local_68);
        this_00 = this->GG;
        pcVar1 = (path->_M_dataplus)._M_p;
        local_a8 = &local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar1,pcVar1 + path->_M_string_length);
        if (local_a8 == &local_98) {
          local_88.field_2._8_8_ = local_98._8_8_;
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        }
        else {
          local_88._M_dataplus._M_p = (pointer)local_a8;
        }
        local_88.field_2._M_allocated_capacity._1_7_ = local_98._M_allocated_capacity._1_7_;
        local_88.field_2._M_local_buf[0] = local_98._M_local_buf[0];
        local_88._M_string_length = local_a0;
        local_a0 = 0;
        local_98._M_local_buf[0] = '\0';
        local_a8 = &local_98;
        SeenCustomCommandOutput(this_00,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        pbVar4 = local_48;
        if (local_a8 != &local_98) {
          operator_delete(local_a8,CONCAT71(local_98._M_allocated_capacity._1_7_,
                                            local_98._M_local_buf[0]) + 1);
          pbVar4 = local_48;
        }
      }
      SeenCustomCommandOutput(this->GG,&local_68);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_38,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      path = path + 1;
    } while (path != pbVar4);
  }
  return;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->BuildFileStream,
                            cmGlobalNinjaGenerator::NINJA_BUILD_FILE)) {
    return false;
  }

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";

  return true;
}